

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapproc.c
# Opt level: O2

void ffswap2(short *svalues,long nvals)

{
  ulong uVar1;
  ulong nvals_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  if (((ulong)svalues & 1) == 0) {
    nvals_00 = (ulong)(0x10 - ((uint)svalues & 0xe) >> 1);
    if (((ulong)svalues & 0xe) == 0) {
      nvals_00 = 0;
    }
    if ((ulong)nvals <= nvals_00) {
      nvals_00 = nvals;
    }
    ffswap2_slow(svalues,nvals_00);
    uVar1 = nvals - nvals_00;
    svalues = svalues + (nvals_00 & 0xffffffff);
    for (; nvals_00 < (uVar1 & 0xfffffffffffffff8); nvals_00 = nvals_00 + 8) {
      auVar2 = *(undefined1 (*) [16])svalues;
      auVar3._0_2_ = auVar2._0_2_ >> 8;
      auVar3._2_2_ = auVar2._2_2_ >> 8;
      auVar3._4_2_ = auVar2._4_2_ >> 8;
      auVar3._6_2_ = auVar2._6_2_ >> 8;
      auVar3._8_2_ = auVar2._8_2_ >> 8;
      auVar3._10_2_ = auVar2._10_2_ >> 8;
      auVar3._12_2_ = auVar2._12_2_ >> 8;
      auVar3._14_2_ = auVar2._14_2_ >> 8;
      auVar2 = psllw(auVar2,8);
      *(undefined1 (*) [16])svalues = auVar2 | auVar3;
      svalues = (short *)((long)svalues + 0x10);
    }
    nvals = nvals - nvals_00;
  }
  ffswap2_slow(svalues,nvals);
  return;
}

Assistant:

void ffswap2(short *svalues,  /* IO - pointer to shorts to be swapped    */
             long nvals)     /* I  - number of shorts to be swapped     */
/*
  swap the bytes in the input short integers: ( 0 1 -> 1 0 )
*/
{
    if ((long)svalues % 2 != 0) { /* should not happen */
        ffswap2_slow(svalues, nvals);
        return;
    }

    long ii;
    size_t peel = get_peel((void*)&svalues[0], sizeof(svalues[0]), nvals, 16);

    ffswap2_slow(svalues, peel);
    for (ii = peel; ii < (nvals - peel - (nvals - peel) % 8); ii+=8) {
        swap2_sse2((char*)&svalues[ii]);
    }
    ffswap2_slow(&svalues[ii], nvals - ii);
}